

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug QtPrivate::printSequentialContainer<QList<QByteArray>>
                 (QDebug *debug,char *which,QList<QByteArray> *c)

{
  bool bVar1;
  QDebug *this;
  const_iterator o;
  QDebugStateSaver *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  const_iterator end;
  const_iterator it;
  QDebugStateSaver saver;
  char in_stack_ffffffffffffff6f;
  QList<QByteArray> *in_stack_ffffffffffffff70;
  QByteArray *in_stack_ffffffffffffff78;
  Stream *pSVar2;
  QDebug *in_stack_ffffffffffffff98;
  Stream *t;
  const_iterator local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  pSVar2 = in_RDI;
  t = in_RDI;
  QDebugStateSaver::QDebugStateSaver(in_RSI,(QDebug *)in_RDI);
  QDebug::nospace((QDebug *)in_RSI);
  this = QDebug::operator<<(in_stack_ffffffffffffff98,(char *)t);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
  local_18.i = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QList<QByteArray>::begin(in_stack_ffffffffffffff70);
  o = QList<QByteArray>::end(in_stack_ffffffffffffff70);
  bVar1 = QList<QByteArray>::const_iterator::operator!=(&local_18,o);
  if (bVar1) {
    QList<QByteArray>::const_iterator::operator*(&local_18);
    QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff78);
    QList<QByteArray>::const_iterator::operator++(&local_18);
  }
  while (bVar1 = QList<QByteArray>::const_iterator::operator!=(&local_18,o), bVar1) {
    in_stack_ffffffffffffff78 = (QByteArray *)QDebug::operator<<(this,(char *)t);
    QList<QByteArray>::const_iterator::operator*(&local_18);
    QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff78);
    QList<QByteArray>::const_iterator::operator++(&local_18);
  }
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
  QDebug::QDebug((QDebug *)in_RDI,(QDebug *)in_stack_ffffffffffffff78);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)pSVar2;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}